

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db)

{
  Db *pDVar1;
  Btree *p;
  Schema *pSVar2;
  void *pvVar3;
  Table *pTable;
  int iVar4;
  sqlite3_value *v;
  HashElem *pHVar5;
  long lVar6;
  long lVar7;
  void *pvVar8;
  
  if (db->magic == 0x64cffc7f) {
    iVar4 = connectionIsBusy(db);
    if (iVar4 == 0) {
      sqlite3RollbackAll(db,0);
      sqlite3CloseSavepoints(db);
      if (0 < db->nDb) {
        lVar6 = 8;
        lVar7 = 0;
        do {
          pDVar1 = db->aDb;
          p = *(Btree **)((long)&pDVar1->zDbSName + lVar6);
          if (p != (Btree *)0x0) {
            sqlite3BtreeClose(p);
            *(undefined8 *)((long)&pDVar1->zDbSName + lVar6) = 0;
            if (lVar7 != 1) {
              *(undefined8 *)(&pDVar1->safety_level + lVar6) = 0;
            }
          }
          lVar7 = lVar7 + 1;
          lVar6 = lVar6 + 0x20;
        } while (lVar7 < db->nDb);
      }
      pSVar2 = db->aDb[1].pSchema;
      if (pSVar2 != (Schema *)0x0) {
        sqlite3SchemaClear(pSVar2);
      }
      sqlite3VtabUnlockList(db);
      sqlite3CollapseDatabaseArray(db);
      for (pHVar5 = (db->aFunc).first; pHVar5 != (HashElem *)0x0; pHVar5 = pHVar5->next) {
        pvVar8 = pHVar5->data;
        do {
          functionDestroy(db,*(FuncDef **)((long)pvVar8 + 0x30));
          pvVar3 = *(void **)((long)pvVar8 + 0x10);
          sqlite3DbFreeNN(db,pvVar8);
          pvVar8 = pvVar3;
        } while (pvVar3 != (void *)0x0);
      }
      sqlite3HashClear(&db->aFunc);
      for (pHVar5 = (db->aCollSeq).first; pHVar5 != (HashElem *)0x0; pHVar5 = pHVar5->next) {
        pvVar8 = pHVar5->data;
        lVar6 = 0x20;
        do {
          if (*(code **)((long)pvVar8 + lVar6) != (code *)0x0) {
            (**(code **)((long)pvVar8 + lVar6))(*(undefined8 *)((long)pvVar8 + lVar6 + -0x10));
          }
          lVar6 = lVar6 + 0x28;
        } while (lVar6 != 0x98);
        sqlite3DbFreeNN(db,pvVar8);
      }
      sqlite3HashClear(&db->aCollSeq);
      for (pHVar5 = (db->aModule).first; pHVar5 != (HashElem *)0x0; pHVar5 = pHVar5->next) {
        pvVar8 = pHVar5->data;
        if (*(code **)((long)pvVar8 + 0x18) != (code *)0x0) {
          (**(code **)((long)pvVar8 + 0x18))(*(undefined8 *)((long)pvVar8 + 0x10));
        }
        pTable = *(Table **)((long)pvVar8 + 0x20);
        if (pTable != (Table *)0x0) {
          *(byte *)&pTable->tabFlags = (byte)pTable->tabFlags | 2;
          sqlite3DeleteTable(db,pTable);
          *(undefined8 *)((long)pvVar8 + 0x20) = 0;
        }
        sqlite3DbFreeNN(db,pvVar8);
      }
      sqlite3HashClear(&db->aModule);
      db->errCode = 0;
      if (db->pErr == (sqlite3_value *)0x0) {
        v = (sqlite3_value *)0x0;
      }
      else {
        sqlite3ErrorFinish(db,0);
        v = db->pErr;
      }
      sqlite3ValueFree(v);
      if (0 < db->nExtension) {
        lVar6 = 0;
        do {
          (*db->pVfs->xDlClose)(db->pVfs,db->aExtension[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < db->nExtension);
      }
      if (db->aExtension != (void **)0x0) {
        sqlite3DbFreeNN(db,db->aExtension);
      }
      db->magic = 0xb5357930;
      pSVar2 = db->aDb[1].pSchema;
      if (pSVar2 != (Schema *)0x0) {
        sqlite3DbFreeNN(db,pSVar2);
      }
      if (db->mutex == (sqlite3_mutex *)0x0) {
        db->magic = 0x9f3c2d33;
      }
      else {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
        db->magic = 0x9f3c2d33;
        if (db->mutex != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexFree)(db->mutex);
        }
      }
      if ((db->lookaside).bMalloced != '\0') {
        sqlite3_free((db->lookaside).pStart);
      }
      sqlite3_free(db);
      return;
    }
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db){
  HashElem *i;                    /* Hash table iterator */
  int j;

  /* If there are outstanding sqlite3_stmt or sqlite3_backup objects
  ** or if the connection has not yet been closed by sqlite3_close_v2(),
  ** then just leave the mutex and return.
  */
  if( db->magic!=SQLITE_MAGIC_ZOMBIE || connectionIsBusy(db) ){
    sqlite3_mutex_leave(db->mutex);
    return;
  }

  /* If we reach this point, it means that the database connection has
  ** closed all sqlite3_stmt and sqlite3_backup objects and has been
  ** passed to sqlite3_close (meaning that it is a zombie).  Therefore,
  ** go ahead and free all resources.
  */

  /* If a transaction is open, roll it back. This also ensures that if
  ** any database schemas have been modified by an uncommitted transaction
  ** they are reset. And that the required b-tree mutex is held to make
  ** the pager rollback and schema reset an atomic operation. */
  sqlite3RollbackAll(db, SQLITE_OK);

  /* Free any outstanding Savepoint structures. */
  sqlite3CloseSavepoints(db);

  /* Close all database connections */
  for(j=0; j<db->nDb; j++){
    struct Db *pDb = &db->aDb[j];
    if( pDb->pBt ){
      sqlite3BtreeClose(pDb->pBt);
      pDb->pBt = 0;
      if( j!=1 ){
        pDb->pSchema = 0;
      }
    }
  }
  /* Clear the TEMP schema separately and last */
  if( db->aDb[1].pSchema ){
    sqlite3SchemaClear(db->aDb[1].pSchema);
  }
  sqlite3VtabUnlockList(db);

  /* Free up the array of auxiliary databases */
  sqlite3CollapseDatabaseArray(db);
  assert( db->nDb<=2 );
  assert( db->aDb==db->aDbStatic );

  /* Tell the code in notify.c that the connection no longer holds any
  ** locks and does not require any further unlock-notify callbacks.
  */
  sqlite3ConnectionClosed(db);

  for(i=sqliteHashFirst(&db->aFunc); i; i=sqliteHashNext(i)){
    FuncDef *pNext, *p;
    p = sqliteHashData(i);
    do{
      functionDestroy(db, p);
      pNext = p->pNext;
      sqlite3DbFree(db, p);
      p = pNext;
    }while( p );
  }
  sqlite3HashClear(&db->aFunc);
  for(i=sqliteHashFirst(&db->aCollSeq); i; i=sqliteHashNext(i)){
    CollSeq *pColl = (CollSeq *)sqliteHashData(i);
    /* Invoke any destructors registered for collation sequence user data. */
    for(j=0; j<3; j++){
      if( pColl[j].xDel ){
        pColl[j].xDel(pColl[j].pUser);
      }
    }
    sqlite3DbFree(db, pColl);
  }
  sqlite3HashClear(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=sqliteHashFirst(&db->aModule); i; i=sqliteHashNext(i)){
    Module *pMod = (Module *)sqliteHashData(i);
    if( pMod->xDestroy ){
      pMod->xDestroy(pMod->pAux);
    }
    sqlite3VtabEponymousTableClear(db, pMod);
    sqlite3DbFree(db, pMod);
  }
  sqlite3HashClear(&db->aModule);
#endif

  sqlite3Error(db, SQLITE_OK); /* Deallocates any cached error strings. */
  sqlite3ValueFree(db->pErr);
  sqlite3CloseExtensions(db);
#if SQLITE_USER_AUTHENTICATION
  sqlite3_free(db->auth.zAuthUser);
  sqlite3_free(db->auth.zAuthPW);
#endif

  db->magic = SQLITE_MAGIC_ERROR;

  /* The temp-database schema is allocated differently from the other schema
  ** objects (using sqliteMalloc() directly, instead of sqlite3BtreeSchema()).
  ** So it needs to be freed here. Todo: Why not roll the temp schema into
  ** the same sqliteMalloc() as the one that allocates the database 
  ** structure?
  */
  sqlite3DbFree(db, db->aDb[1].pSchema);
  sqlite3_mutex_leave(db->mutex);
  db->magic = SQLITE_MAGIC_CLOSED;
  sqlite3_mutex_free(db->mutex);
  assert( db->lookaside.nOut==0 );  /* Fails on a lookaside memory leak */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  sqlite3_free(db);
}